

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Copter.h
# Opt level: O1

void __thiscall chrono::copter::Copter<6>::ControlIncremental(Copter<6> *this,double *inputs)

{
  double dVar1;
  pointer psVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  bool bVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  
  psVar2 = (this->speeds).
           super__Vector_base<std::shared_ptr<chrono::ChFunction_Const>,_std::allocator<std::shared_ptr<chrono::ChFunction_Const>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dVar1 = this->rps_max;
  lVar6 = 0;
  do {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = *(double *)((long)this->u_p + lVar6) + *(double *)((long)inputs + lVar6);
    auVar3 = vminsd_avx(ZEXT816(0x3ff0000000000000),auVar8);
    uVar4 = vcmpsd_avx512f(auVar8,ZEXT816(0xbff0000000000000),1);
    bVar5 = (bool)((byte)uVar4 & 1);
    dVar7 = (double)((ulong)bVar5 * -0x4010000000000000 + (ulong)!bVar5 * auVar3._0_8_);
    *(double *)((long)this->u_p + lVar6) = dVar7;
    *(double *)
     (*(long *)((long)&(psVar2->
                       super___shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2>).
                       _M_ptr + lVar6 * 2) + 8) = dVar7 * dVar1 * 6.283185307179586;
    lVar6 = lVar6 + 8;
  } while (lVar6 != 0x30);
  return;
}

Assistant:

void Copter<nop>::ControlIncremental(double inputs[nop]) {
    for (int i = 0; i < nop; i++) {
        u_p[i] = ChClamp(u_p[i] + inputs[i], -1.0, 1.0);
        speeds[i]->Set_yconst(u_p[i] * rps_max * CH_C_2PI);
    }
}